

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O1

int arangodb::velocypack::Collection::remove(char *__filename)

{
  long lVar1;
  _Alloc_hider _Var2;
  ValueLength VVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  long *in_RDX;
  int __fd;
  uint8_t *in_RSI;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_1;
  long lVar7;
  string_view attrName;
  string key;
  ObjectIterator it;
  Slice local_98;
  Slice local_90;
  string local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  size_type sVar5;
  
  local_90._start = in_RSI;
  if (0x60 < (ulong)(in_RDX[1] - *in_RDX)) {
    VVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_90);
    if (10 < VVar3) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      lVar7 = *in_RDX;
      lVar1 = in_RDX[1];
      if (lVar7 != lVar1) {
        do {
          std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::_M_emplace<std::__cxx11::string_const&>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&local_68,lVar7);
          lVar7 = lVar7 + 0x20;
        } while (lVar7 != lVar1);
      }
      remove(__filename);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      goto LAB_00109661;
    }
  }
  Builder::Builder((Builder *)__filename);
  Value::Value((Value *)&local_68,Object,false);
  Builder::addInternal<arangodb::velocypack::Value>((Builder *)__filename,(Value *)&local_68);
  ObjectIterator::ObjectIterator((ObjectIterator *)&local_68,local_90,false);
  __fd = (int)local_90._start;
  if ((_Hash_node_base *)local_68._M_element_count != local_68._M_before_begin._M_nxt) {
    do {
      local_98 = ObjectIterator::key((ObjectIterator *)&local_68,true);
      SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::copyString_abi_cxx11_
                (&local_88,
                 (SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)&local_98);
      lVar7 = in_RDX[1];
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (*in_RDX,lVar7,&local_88);
      sVar5 = local_88._M_string_length;
      _Var2._M_p = local_88._M_dataplus._M_p;
      __fd = (int)lVar7;
      if (_Var4._M_current ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX[1]) {
        local_98 = ObjectIterator::value((ObjectIterator *)&local_68);
        attrName._M_str = _Var2._M_p;
        attrName._M_len = sVar5;
        Builder::addInternal<arangodb::velocypack::Slice>((Builder *)__filename,attrName,&local_98);
        __fd = (int)sVar5;
      }
      ObjectIterator::next((ObjectIterator *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        uVar6 = local_88.field_2._M_allocated_capacity + 1;
        operator_delete(local_88._M_dataplus._M_p,uVar6);
        __fd = (int)uVar6;
      }
    } while ((_Hash_node_base *)local_68._M_element_count != local_68._M_before_begin._M_nxt);
  }
  Builder::close((Builder *)__filename,__fd);
LAB_00109661:
  return (int)__filename;
}

Assistant:

Builder Collection::remove(Slice slice,
                           std::vector<std::string> const& keys) {
  // check if there are so many keys that we want to use the hash-based version
  // cut-off values are arbitrary...
  if (keys.size() >= 4 && slice.length() > 10) {
    return remove(slice, makeSet(keys));
  }

  Builder b;
  b.add(Value(ValueType::Object));

  ObjectIterator it(slice, /*useSequentialIteration*/ false);

  while (it.valid()) {
    auto key = it.key(true).copyString();
    if (std::find(keys.begin(), keys.end(), key) == keys.end()) {
      b.add(key, it.value());
    }
    it.next();
  }

  b.close();
  return b;
}